

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall
setup::info::load_entries<setup::language_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::language_entry,_std::allocator<setup::language_entry>_> *result,
          enum_type entry_type)

{
  _Base_bitset<1UL> _Var1;
  long lVar2;
  bool bVar3;
  language_entry entry;
  flags<setup::info::entry_types_Enum_,_21UL> local_1b0;
  language_entry local_1a8;
  
  local_1b0._flags.super__Base_bitset<1UL>._M_w = entries._flags.super__Base_bitset<1UL>._M_w;
  std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>::clear(result);
  _Var1._M_w = (_WordT)flags<setup::info::entry_types_Enum_,_21UL>::operator&(&local_1b0,entry_type)
  ;
  if ((_Base_bitset<1UL>)_Var1._M_w == (_Base_bitset<1UL>)0x0) {
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      local_1a8.name._M_dataplus._M_p = (pointer)&local_1a8.name.field_2;
      local_1a8.name._M_string_length = 0;
      local_1a8.name.field_2._M_local_buf[0] = '\0';
      local_1a8.language_name._M_dataplus._M_p = (pointer)&local_1a8.language_name.field_2;
      local_1a8.language_name._M_string_length = 0;
      local_1a8.language_name.field_2._M_local_buf[0] = '\0';
      local_1a8.dialog_font._M_dataplus._M_p = (pointer)&local_1a8.dialog_font.field_2;
      local_1a8.dialog_font._M_string_length = 0;
      local_1a8.dialog_font.field_2._M_local_buf[0] = '\0';
      local_1a8.title_font._M_dataplus._M_p = (pointer)&local_1a8.title_font.field_2;
      local_1a8.title_font._M_string_length = 0;
      local_1a8.title_font.field_2._M_local_buf[0] = '\0';
      local_1a8.welcome_font._M_dataplus._M_p = (pointer)&local_1a8.welcome_font.field_2;
      local_1a8.welcome_font._M_string_length = 0;
      local_1a8.welcome_font.field_2._M_local_buf[0] = '\0';
      local_1a8.copyright_font._M_dataplus._M_p = (pointer)&local_1a8.copyright_font.field_2;
      local_1a8.copyright_font._M_string_length = 0;
      local_1a8.copyright_font.field_2._M_local_buf[0] = '\0';
      local_1a8.data._M_dataplus._M_p = (pointer)&local_1a8.data.field_2;
      local_1a8.data._M_string_length = 0;
      local_1a8.data.field_2._M_local_buf[0] = '\0';
      local_1a8.license_text._M_dataplus._M_p = (pointer)&local_1a8.license_text.field_2;
      local_1a8.license_text._M_string_length = 0;
      local_1a8.license_text.field_2._M_local_buf[0] = '\0';
      local_1a8.info_before._M_dataplus._M_p = (pointer)&local_1a8.info_before.field_2;
      local_1a8.info_before._M_string_length = 0;
      local_1a8.info_before.field_2._M_local_buf[0] = '\0';
      local_1a8.info_after._M_string_length = 0;
      local_1a8.info_after.field_2._M_local_buf[0] = '\0';
      local_1a8.info_after._M_dataplus._M_p = (pointer)&local_1a8.info_after.field_2;
      language_entry::load(&local_1a8,is,this);
      language_entry::~language_entry(&local_1a8);
    }
  }
  else {
    std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>::resize(result,count)
    ;
    lVar2 = 0;
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      language_entry::load
                ((language_entry *)
                 ((long)&(((result->
                           super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>
                           )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                 lVar2),is,this);
      lVar2 = lVar2 + 0x178;
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}